

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

ctmbstr textFromOneNode(TidyDocImpl *doc,Node *node)

{
  tmbchar *ptVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  ptVar1 = (doc->access).text;
  if (node == (Node *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar4 = (ulong)node->start;
    for (uVar2 = 0;
        (uVar3 = uVar2, uVar4 < node->end &&
        ((doc->access).text[uVar2] = doc->lexer->lexbuf[uVar4], uVar3 = 0x7f, uVar2 != 0x7f));
        uVar2 = uVar2 + 1) {
      uVar4 = uVar4 + 1;
    }
    uVar3 = uVar3 & 0xffffffff;
  }
  ptVar1[uVar3] = '\0';
  return ptVar1;
}

Assistant:

static ctmbstr textFromOneNode( TidyDocImpl* doc, Node* node )
{
    uint i;
    uint x = 0;
    tmbstr txt = doc->access.text;
    
    if ( node )
    {
        /* Copy contents of a text node */
        for (i = node->start; i < node->end; ++i, ++x )
        {
            txt[x] = doc->lexer->lexbuf[i];

            /* Check buffer overflow */
            if ( x >= sizeof(doc->access.text)-1 )
                break;
        }
    }

    txt[x] = '\0';
    return txt;
}